

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O1

bool __thiscall Assimp::DeboneProcess::ConsiderMesh(DeboneProcess *this,aiMesh *pMesh)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  aiBone *paVar5;
  ulong uVar6;
  Logger *this_00;
  ulong uVar7;
  undefined4 uVar8;
  aiFace *paVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong uVar13;
  vector<bool,_std::allocator<bool>_> isBoneNecessary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  allocator_type local_89;
  DeboneProcess *local_88;
  float local_80;
  value_type_conflict1 local_7c;
  vector<bool,_std::allocator<bool>_> local_78;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  ulong local_38;
  
  if (pMesh->mNumBones == 0 || pMesh->mBones == (aiBone **)0x0) {
    bVar12 = false;
  }
  else {
    local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    local_88 = this;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_78,(ulong)pMesh->mNumBones,(bool *)&local_50,(allocator_type *)&local_7c);
    local_7c = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_50,(ulong)pMesh->mNumVertices,&local_7c,&local_89);
    if (pMesh->mNumBones != 0) {
      uVar13 = 0;
      bVar12 = false;
      do {
        paVar5 = pMesh->mBones[uVar13];
        if (paVar5->mNumWeights != 0) {
          uVar10 = 1L << ((byte)uVar13 & 0x3f);
          bVar4 = (byte)uVar13 & 0x3f;
          local_38 = -2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4;
          uVar11 = 0;
          do {
            fVar1 = paVar5->mWeights[uVar11].mWeight;
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              local_80 = fVar1;
              if (local_88->mThreshold <= fVar1) {
                uVar6 = (ulong)paVar5->mWeights[uVar11].mVertexId;
                uVar7 = (ulong)*(uint *)(CONCAT71(local_50.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_50.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                        uVar6 * 4);
                uVar8 = (undefined4)uVar13;
                if ((uVar7 == 0xffffffff) || (uVar8 = 0xfffffffe, uVar13 != uVar7)) {
                  *(undefined4 *)
                   (CONCAT71(local_50.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,
                             local_50.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_1_) + uVar6 * 4) = uVar8;
                }
                else {
                  this_00 = DefaultLogger::get();
                  Logger::warn(this_00,"Encountered double entry in bone weights");
                }
              }
              uVar6 = local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6];
              if ((uVar6 & uVar10) == 0) {
                uVar7 = uVar6 | uVar10;
                if (local_88->mThreshold <= local_80) {
                  uVar7 = uVar6 & local_38;
                }
                local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] = uVar7;
              }
            }
            uVar11 = uVar11 + 1;
            paVar5 = pMesh->mBones[uVar13];
          } while (uVar11 < paVar5->mNumWeights);
        }
        if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          bVar12 = true;
        }
        uVar13 = uVar13 + 1;
      } while (uVar13 < pMesh->mNumBones);
      if ((bVar12) && (pMesh->mNumFaces != 0)) {
        uVar13 = 0;
        do {
          paVar9 = pMesh->mFaces;
          if (1 < paVar9[uVar13].mNumIndices) {
            uVar2 = *(uint *)(CONCAT71(local_50.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_50.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                             (ulong)*paVar9[uVar13].mIndices * 4);
            uVar10 = 1;
            do {
              uVar3 = *(uint *)(CONCAT71(local_50.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_50.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                               (ulong)paVar9[uVar13].mIndices[uVar10] * 4);
              if (uVar2 != uVar3) {
                if (uVar2 < pMesh->mNumBones) {
                  local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
                       local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] |
                       1L << ((byte)uVar2 & 0x3f);
                }
                if (uVar3 < pMesh->mNumBones) {
                  local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] =
                       local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] |
                       1L << ((byte)uVar3 & 0x3f);
                }
              }
              uVar10 = uVar10 + 1;
              paVar9 = pMesh->mFaces;
            } while (uVar10 < paVar9[uVar13].mNumIndices);
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < pMesh->mNumFaces);
      }
    }
    if (pMesh->mNumBones == 0) {
      bVar12 = false;
    }
    else {
      uVar13 = 0;
      bVar12 = false;
      do {
        if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
          local_88->mNumBonesCanDoWithout = local_88->mNumBonesCanDoWithout + 1;
          bVar12 = true;
        }
        local_88->mNumBones = local_88->mNumBones + 1;
        uVar13 = uVar13 + 1;
      } while (uVar13 < pMesh->mNumBones);
    }
    if ((void *)CONCAT71(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
      operator_delete((void *)CONCAT71(local_50.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_50.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_));
    }
    if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return bVar12;
}

Assistant:

bool DeboneProcess::ConsiderMesh(const aiMesh* pMesh)
{
    if(!pMesh->HasBones()) {
        return false;
    }

    bool split = false;

    //interstitial faces not permitted
    bool isInterstitialRequired = false;

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;
            if(w>=mThreshold)   {

                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }

        if(!isBoneNecessary[i])  {
            isInterstitialRequired = true;
        }
    }

    if(isInterstitialRequired) {
        for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
            unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

            for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
                unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

                if(v!=w)    {
                    if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                    if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
                }
            }
        }
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        if(!isBoneNecessary[i]) {
            mNumBonesCanDoWithout++;
            split = true;
        }

        mNumBones++;
    }
    return split;
}